

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_deafen(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  
  if (in_RDX == in_RCX) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    bVar1 = is_affected(in_RCX,in_EDI);
    if (bVar1) {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          in_stack_ffffffffffffff68,0);
    }
    else {
      bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                          ,in_stack_ffffffffffffffa4);
      if (bVar1) {
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
            in_stack_ffffffffffffff68,0);
      }
      else {
        init_affect((AFFECT_DATA *)0x62234f);
        affect_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
            in_stack_ffffffffffffff68,0);
        send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
  }
  return;
}

Assistant:

void spell_deafen(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (ch == victim)
	{
		send_to_char("Deafen who?\n\r", ch);
		return;
	}

	if (is_affected(victim, sn))
	{
		act("$N is already deaf.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	if (saves_spell(level - 2, victim, DAM_CHARM))
	{
		act("You fail to deafen $N.", ch, 0, victim, TO_CHAR);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = level / 12;
	af.modifier = 0;
	af.location = 0;
	af.mod_name = MOD_HEARING;
	affect_to_char(victim, &af);

	act("You have deafened $N!", ch, nullptr, victim, TO_CHAR);
	send_to_char("The world around you fades to silence.\n\r", victim);
}